

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

ImGuiWindowSettings * ImGui::CreateNewWindowSettings(char *name)

{
  int *piVar1;
  undefined8 *puVar2;
  ImGuiContext *pIVar3;
  int iVar4;
  ImU32 IVar5;
  ImGuiWindowSettings *pIVar6;
  char *pcVar7;
  int iVar8;
  int iVar9;
  ImGuiWindowSettings *pIVar10;
  ImGuiContext *ctx;
  
  pIVar3 = GImGui;
  iVar4 = (GImGui->SettingsWindows).Size;
  if (iVar4 == (GImGui->SettingsWindows).Capacity) {
    if (iVar4 == 0) {
      iVar8 = 8;
    }
    else {
      iVar8 = iVar4 / 2 + iVar4;
    }
    iVar9 = iVar4 + 1;
    if (iVar4 + 1 < iVar8) {
      iVar9 = iVar8;
    }
    piVar1 = &(GImGui->IO).MetricsActiveAllocations;
    *piVar1 = *piVar1 + 1;
    pIVar6 = (ImGuiWindowSettings *)(*GImAllocatorAllocFunc)((long)iVar9 << 5,GImAllocatorUserData);
    pIVar10 = (pIVar3->SettingsWindows).Data;
    if (pIVar10 != (ImGuiWindowSettings *)0x0) {
      memcpy(pIVar6,pIVar10,(long)(pIVar3->SettingsWindows).Size << 5);
      pIVar10 = (pIVar3->SettingsWindows).Data;
      if ((pIVar10 != (ImGuiWindowSettings *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + -1;
      }
      (*GImAllocatorFreeFunc)(pIVar10,GImAllocatorUserData);
    }
    (pIVar3->SettingsWindows).Data = pIVar6;
    (pIVar3->SettingsWindows).Capacity = iVar9;
    iVar4 = (pIVar3->SettingsWindows).Size;
  }
  else {
    pIVar6 = (GImGui->SettingsWindows).Data;
  }
  puVar2 = (undefined8 *)((long)&pIVar6[iVar4].Pos.x + 1);
  *puVar2 = 0;
  puVar2[1] = 0;
  pIVar6 = pIVar6 + iVar4;
  pIVar6->Name = (char *)0x0;
  pIVar6->ID = 0;
  (pIVar6->Pos).x = 0.0;
  iVar4 = (pIVar3->SettingsWindows).Size;
  (pIVar3->SettingsWindows).Size = iVar4 + 1;
  pIVar6 = (pIVar3->SettingsWindows).Data;
  pIVar10 = pIVar6 + iVar4;
  pcVar7 = ImStrdup(name);
  pIVar10->Name = pcVar7;
  IVar5 = ImHash(name,0,0);
  pIVar6[iVar4].ID = IVar5;
  return pIVar10;
}

Assistant:

ImGuiWindowSettings* ImGui::CreateNewWindowSettings(const char* name)
{
    ImGuiContext& g = *GImGui;
    g.SettingsWindows.push_back(ImGuiWindowSettings());
    ImGuiWindowSettings* settings = &g.SettingsWindows.back();
    settings->Name = ImStrdup(name);
    settings->ID = ImHash(name, 0);
    return settings;
}